

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Vec_IntPushOrder(Vec_Int_t *p,int Entry)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  uint uVar5;
  int nCapMin;
  
  iVar1 = p->nSize;
  if (iVar1 == p->nCap) {
    nCapMin = 0x10;
    if (0xf < iVar1) {
      nCapMin = iVar1 * 2;
    }
    Vec_IntGrow(p,nCapMin);
  }
  uVar2 = p->nSize;
  p->nSize = uVar2 + 1;
  piVar3 = p->pArray;
  for (uVar4 = (ulong)uVar2;
      (uVar5 = (int)uVar2 >> 0x1f & uVar2, 0 < (int)(uint)uVar4 &&
      (uVar5 = (uint)uVar4, Entry < piVar3[uVar4 - 1])); uVar4 = uVar4 - 1) {
    piVar3[uVar4] = piVar3[uVar4 - 1];
  }
  piVar3[(int)uVar5] = Entry;
  return;
}

Assistant:

static inline void Vec_IntPushOrder( Vec_Int_t * p, int Entry )
{
    int i;
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->nSize++;
    for ( i = p->nSize-2; i >= 0; i-- )
        if ( p->pArray[i] > Entry )
            p->pArray[i+1] = p->pArray[i];
        else
            break;
    p->pArray[i+1] = Entry;
}